

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O0

void __thiscall
script_standard_tests::script_standard_ExtractDestination::test_method
          (script_standard_ExtractDestination *this)

{
  Span<const_unsigned_char> input;
  Span<unsigned_char> output;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  span<const_unsigned_char,_18446744073709551615UL> b_05;
  span<const_unsigned_char,_18446744073709551615UL> b_06;
  initializer_list<unsigned_char> __l;
  bool bVar1;
  CHash160 *scriptPubKey;
  WitnessUnknown *pWVar2;
  long in_FS_OFFSET;
  WitnessUnknown unk;
  CKey key;
  WitnessV0ScriptHash scripthash;
  WitnessV0KeyHash keyhash;
  CScript redeemScript;
  CTxDestination address;
  CScript s;
  CPubKey pubkey;
  CSHA256 *in_stack_fffffffffffff268;
  undefined4 in_stack_fffffffffffff270;
  int in_stack_fffffffffffff274;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffff278;
  undefined7 in_stack_fffffffffffff280;
  undefined1 in_stack_fffffffffffff287;
  CHash160 *in_stack_fffffffffffff288;
  undefined7 in_stack_fffffffffffff290;
  undefined1 in_stack_fffffffffffff297;
  undefined4 in_stack_fffffffffffff298;
  opcodetype in_stack_fffffffffffff29c;
  const_string *in_stack_fffffffffffff2a0;
  const_string *pcVar3;
  undefined7 in_stack_fffffffffffff2a8;
  undefined1 in_stack_fffffffffffff2af;
  undefined8 in_stack_fffffffffffff2b0;
  undefined7 in_stack_fffffffffffff2b8;
  undefined1 in_stack_fffffffffffff2bf;
  CTxDestination *in_stack_fffffffffffff350;
  CScript *in_stack_fffffffffffff358;
  const_string local_ad8 [2];
  lazy_ostream local_ab8 [2];
  assertion_result local_a98 [4];
  const_string local_a28 [2];
  lazy_ostream local_a08 [2];
  assertion_result local_9e8 [4];
  const_string local_988 [2];
  lazy_ostream local_968 [2];
  assertion_result local_948 [2];
  const_string local_910 [2];
  lazy_ostream local_8f0 [2];
  assertion_result local_8d0 [4];
  const_string local_870 [2];
  lazy_ostream local_850 [2];
  assertion_result local_830 [3];
  const_string local_7d8 [2];
  lazy_ostream local_7b8 [2];
  assertion_result local_798 [4];
  const_string local_738 [2];
  lazy_ostream local_718 [2];
  assertion_result local_6f8 [4];
  const_string local_690 [2];
  lazy_ostream local_670 [2];
  assertion_result local_650 [4];
  const_string local_5f0 [2];
  lazy_ostream local_5d0 [2];
  assertion_result local_5b0 [2];
  const_string local_578 [2];
  lazy_ostream local_558 [2];
  assertion_result local_538 [4];
  const_string local_4d8 [2];
  lazy_ostream local_4b8 [2];
  assertion_result local_498 [2];
  const_string local_460 [2];
  lazy_ostream local_440 [2];
  assertion_result local_420 [4];
  const_string local_3c0 [2];
  lazy_ostream local_3a0 [2];
  assertion_result local_380 [2];
  const_string local_348 [2];
  lazy_ostream local_328 [2];
  assertion_result local_308 [4];
  undefined1 local_291;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
  CScript::CScript((CScript *)in_stack_fffffffffffff268);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffff268);
  CScript::clear((CScript *)in_stack_fffffffffffff268);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
  b._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff2a8;
  b._M_ptr = (pointer)in_stack_fffffffffffff2a0;
  b._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff2af;
  CScript::operator<<((CScript *)in_stack_fffffffffffff288,b);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    ExtractDestination(in_stack_fffffffffffff358,in_stack_fffffffffffff350);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_308,local_328,local_348,0xe5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    std::
    get<PubKeyDestination,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff268);
    PubKeyDestination::PubKeyDestination
              ((PubKeyDestination *)in_stack_fffffffffffff268,(CPubKey *)0xa12115);
    ::operator==((PubKeyDestination *)in_stack_fffffffffffff278,
                 (PubKeyDestination *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270))
    ;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_380,local_3a0,local_3c0,0xe6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_fffffffffffff268);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  CPubKey::GetID((CPubKey *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
  ToByteVector<CKeyID>((CKeyID *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
  b_00._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff2a8;
  b_00._M_ptr = (pointer)in_stack_fffffffffffff2a0;
  b_00._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff2af;
  CScript::operator<<((CScript *)in_stack_fffffffffffff288,b_00);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    ExtractDestination(in_stack_fffffffffffff358,in_stack_fffffffffffff350);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_420,local_440,local_460,0xeb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    std::
    get<PKHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff268);
    PKHash::PKHash((PKHash *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (CPubKey *)in_stack_fffffffffffff278);
    BaseHash<uint160>::operator==
              ((BaseHash<uint160> *)in_stack_fffffffffffff278,
               (BaseHash<uint160> *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_498,local_4b8,local_4d8,0xec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::CScript((CScript *)in_stack_fffffffffffff268,(CScript *)0xa12624);
  CScript::clear((CScript *)in_stack_fffffffffffff268);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  CScriptID::CScriptID
            ((CScriptID *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
             (CScript *)in_stack_fffffffffffff278);
  ToByteVector<CScriptID>
            ((CScriptID *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
  b_01._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff2a8;
  b_01._M_ptr = (pointer)in_stack_fffffffffffff2a0;
  b_01._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff2af;
  CScript::operator<<((CScript *)in_stack_fffffffffffff288,b_01);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    ExtractDestination(in_stack_fffffffffffff358,in_stack_fffffffffffff350);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_538,local_558,local_578,0xf2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    std::
    get<ScriptHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff268);
    ScriptHash::ScriptHash
              ((ScriptHash *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
               (CScript *)in_stack_fffffffffffff278);
    BaseHash<uint160>::operator==
              ((BaseHash<uint160> *)in_stack_fffffffffffff278,
               (BaseHash<uint160> *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5b0,local_5d0,local_5f0,0xf3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_fffffffffffff268);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
  b_02._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff2a8;
  b_02._M_ptr = (pointer)in_stack_fffffffffffff2a0;
  b_02._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff2af;
  CScript::operator<<((CScript *)in_stack_fffffffffffff288,b_02);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    ExtractDestination(in_stack_fffffffffffff358,in_stack_fffffffffffff350);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_650,local_670,local_690,0xf8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_fffffffffffff268);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  local_291 = 0x4b;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff268);
  __l._M_len._0_7_ = in_stack_fffffffffffff2b8;
  __l._M_array = (iterator)in_stack_fffffffffffff2b0;
  __l._M_len._7_1_ = in_stack_fffffffffffff2bf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),__l,
             (allocator_type *)in_stack_fffffffffffff2a0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
  b_03._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff2a8;
  b_03._M_ptr = (pointer)in_stack_fffffffffffff2a0;
  b_03._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff2af;
  CScript::operator<<((CScript *)in_stack_fffffffffffff288,b_03);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff268);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    ExtractDestination(in_stack_fffffffffffff358,in_stack_fffffffffffff350);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6f8,local_718,local_738,0xfd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_fffffffffffff268);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  CPubKey::GetID((CPubKey *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
  ToByteVector<CKeyID>((CKeyID *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
  b_04._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff2a8;
  b_04._M_ptr = (pointer)in_stack_fffffffffffff2a0;
  b_04._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff2af;
  CScript::operator<<((CScript *)in_stack_fffffffffffff288,b_04);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    ExtractDestination(in_stack_fffffffffffff358,in_stack_fffffffffffff350);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_798,local_7b8,local_7d8,0x102,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)in_stack_fffffffffffff268);
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_1a8 = 0;
  CHash160::CHash160((CHash160 *)in_stack_fffffffffffff268);
  Span<const_unsigned_char>::Span<CPubKey>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff278,
             (CPubKey *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             in_stack_fffffffffffff268);
  input.m_data._7_1_ = in_stack_fffffffffffff287;
  input.m_data._0_7_ = in_stack_fffffffffffff280;
  input.m_size = (size_t)in_stack_fffffffffffff288;
  scriptPubKey = CHash160::Write((CHash160 *)in_stack_fffffffffffff278,input);
  Span<unsigned_char>::Span<WitnessV0KeyHash>
            ((Span<unsigned_char> *)in_stack_fffffffffffff278,
             (WitnessV0KeyHash *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             in_stack_fffffffffffff268);
  output.m_data._7_1_ = in_stack_fffffffffffff297;
  output.m_data._0_7_ = in_stack_fffffffffffff290;
  output.m_size._0_4_ = in_stack_fffffffffffff298;
  output.m_size._4_4_ = in_stack_fffffffffffff29c;
  CHash160::Finalize(in_stack_fffffffffffff288,output);
  do {
    pcVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    std::
    get<WitnessV0KeyHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff268);
    BaseHash<uint160>::operator==
              ((BaseHash<uint160> *)in_stack_fffffffffffff278,
               (BaseHash<uint160> *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_830,local_850,local_870,0x105,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_fffffffffffff268);
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)in_stack_fffffffffffff268);
  CSHA256::CSHA256(in_stack_fffffffffffff268);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::data
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff268);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffff278);
  CSHA256::Write((CSHA256 *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                 (uchar *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290),
                 (size_t)in_stack_fffffffffffff288);
  BaseHash<uint256>::begin((BaseHash<uint256> *)in_stack_fffffffffffff268);
  CSHA256::Finalize((CSHA256 *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                    (uchar *)in_stack_fffffffffffff278);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  ToByteVector<WitnessV0ScriptHash>
            ((WitnessV0ScriptHash *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
  b_05._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff2a8;
  b_05._M_ptr = (pointer)in_stack_fffffffffffff2a0;
  b_05._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff2af;
  CScript::operator<<((CScript *)in_stack_fffffffffffff288,b_05);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    ExtractDestination((CScript *)scriptPubKey,(CTxDestination *)pcVar3);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8d0,local_8f0,local_910,0x10c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    std::
    get<WitnessV0ScriptHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff268);
    BaseHash<uint256>::operator==
              ((BaseHash<uint256> *)in_stack_fffffffffffff278,
               (BaseHash<uint256> *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_948,local_968,local_988,0x10d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_fffffffffffff268);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
  b_06._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff2a8;
  b_06._M_ptr = (pointer)in_stack_fffffffffffff2a0;
  b_06._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff2af;
  CScript::operator<<((CScript *)in_stack_fffffffffffff288,b_06);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0,
               CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    ExtractDestination((CScript *)scriptPubKey,(CTxDestination *)pcVar3);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9e8,local_a08,local_a28,0x112,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    in_stack_fffffffffffff2af = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff2af);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
  WitnessUnknown::WitnessUnknown
            ((WitnessUnknown *)in_stack_fffffffffffff278,in_stack_fffffffffffff274,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff268);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff278);
  do {
    pcVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
               pcVar3,CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (const_string *)CONCAT17(in_stack_fffffffffffff297,in_stack_fffffffffffff290));
    pWVar2 = std::
             get<WitnessUnknown,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                       ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)in_stack_fffffffffffff268);
    in_stack_fffffffffffff298 = SUB84(pWVar2,0);
    in_stack_fffffffffffff29c = (opcodetype)((ulong)pWVar2 >> 0x20);
    in_stack_fffffffffffff297 =
         ::operator==((WitnessUnknown *)
                      CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                      (WitnessUnknown *)in_stack_fffffffffffff278);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff278,
               SUB41((uint)in_stack_fffffffffffff274 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (basic_cstring<const_char> *)in_stack_fffffffffffff268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff278,
               (pointer)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
               (unsigned_long)in_stack_fffffffffffff268);
    in_stack_fffffffffffff268 = (CSHA256 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a98,local_ab8,local_ad8,0x114,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff268);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff268);
    in_stack_fffffffffffff287 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff287);
  WitnessUnknown::~WitnessUnknown((WitnessUnknown *)in_stack_fffffffffffff268);
  CScript::~CScript((CScript *)in_stack_fffffffffffff268);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff268);
  CScript::~CScript((CScript *)in_stack_fffffffffffff268);
  CKey::~CKey((CKey *)in_stack_fffffffffffff268);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_ExtractDestination)
{
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    CScript s;
    CTxDestination address;

    // TxoutType::PUBKEY
    s.clear();
    s << ToByteVector(pubkey) << OP_CHECKSIG;
    BOOST_CHECK(!ExtractDestination(s, address));
    BOOST_CHECK(std::get<PubKeyDestination>(address) == PubKeyDestination(pubkey));

    // TxoutType::PUBKEYHASH
    s.clear();
    s << OP_DUP << OP_HASH160 << ToByteVector(pubkey.GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<PKHash>(address) == PKHash(pubkey));

    // TxoutType::SCRIPTHASH
    CScript redeemScript(s); // initialize with leftover P2PKH script
    s.clear();
    s << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<ScriptHash>(address) == ScriptHash(redeemScript));

    // TxoutType::MULTISIG
    s.clear();
    s << OP_1 << ToByteVector(pubkey) << OP_1 << OP_CHECKMULTISIG;
    BOOST_CHECK(!ExtractDestination(s, address));

    // TxoutType::NULL_DATA
    s.clear();
    s << OP_RETURN << std::vector<unsigned char>({75});
    BOOST_CHECK(!ExtractDestination(s, address));

    // TxoutType::WITNESS_V0_KEYHASH
    s.clear();
    s << OP_0 << ToByteVector(pubkey.GetID());
    BOOST_CHECK(ExtractDestination(s, address));
    WitnessV0KeyHash keyhash;
    CHash160().Write(pubkey).Finalize(keyhash);
    BOOST_CHECK(std::get<WitnessV0KeyHash>(address) == keyhash);

    // TxoutType::WITNESS_V0_SCRIPTHASH
    s.clear();
    WitnessV0ScriptHash scripthash;
    CSHA256().Write(redeemScript.data(), redeemScript.size()).Finalize(scripthash.begin());
    s << OP_0 << ToByteVector(scripthash);
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<WitnessV0ScriptHash>(address) == scripthash);

    // TxoutType::WITNESS_UNKNOWN with unknown version
    s.clear();
    s << OP_1 << ToByteVector(pubkey);
    BOOST_CHECK(ExtractDestination(s, address));
    WitnessUnknown unk{1, ToByteVector(pubkey)};
    BOOST_CHECK(std::get<WitnessUnknown>(address) == unk);
}